

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O1

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<6>::
EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<6> *this,PointDVectorIterator begin,
          PointDVectorIterator end)

{
  int *piVar1;
  pointer puVar2;
  uint uVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  uint32_t *puVar7;
  uint *puVar8;
  pointer pvVar9;
  PointDVector<unsigned_int> *pPVar10;
  PointDVectorIterator PVar11;
  PointDVectorIterator PVar12;
  uint32_t uVar13;
  ulong uVar14;
  uint uVar15;
  _Elt_pointer pEVar16;
  ulong uVar17;
  uint uVar18;
  uint32_t uVar19;
  int iVar20;
  uint uVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar22;
  ulong uVar23;
  VectorUint32 *levels;
  bool bVar24;
  PointDVectorIterator split;
  stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  status_stack;
  int local_140;
  undefined4 uStack_13c;
  PointDVector<unsigned_int> *pPStack_138;
  uint32_t local_130;
  undefined4 uStack_12c;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_128;
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  local_e8;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_98;
  DirectBitEncoder *local_50;
  FoldedBit32Encoder<draco::RAnsBitEncoder> *local_48;
  ulong local_40;
  PointDVector<unsigned_int> *local_38;
  
  PVar12 = end;
  PVar11 = begin;
  local_98.begin.item_ = local_98.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_98,(allocator_type *)&local_128)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_e8);
  if (local_e8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_e8._M_impl.super__Deque_impl_data._M_map);
  }
  local_98.begin.item_ = local_98.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_98,(allocator_type *)&local_128)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_e8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_e8._M_impl.super__Deque_impl_data._M_map);
  }
  local_98.begin.dimensionality_ = begin.dimensionality_;
  local_98.begin._20_4_ = begin._20_4_;
  local_98.begin.item_ = PVar11.item_;
  pPVar10 = PVar11.vec_;
  local_98.end.item_ = end.item_;
  sVar5 = local_98.end.item_;
  local_98.end.vec_ = end.vec_;
  local_98.end.dimensionality_ = end.dimensionality_;
  local_98.end._20_4_ = end._20_4_;
  local_98.last_axis = 0;
  local_98.stack_pos = 0;
  local_98.end.item_._0_4_ = (int)PVar12.item_;
  local_98.num_remaining_points = (int)local_98.end.item_ - (int)begin.item_;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_98.begin.vec_ = pPVar10;
  local_98.end.item_ = sVar5;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::_M_initialize_map(&local_e8,0);
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
    ::
    _M_push_back_aux<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>const&>
              ((deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                *)&local_e8,&local_98);
  }
  else {
    (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_98.last_axis;
    (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_98.num_remaining_points;
    *(ulong *)&(local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos =
         CONCAT44(local_98._60_4_,local_98.stack_pos);
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).vec_ = local_98.end.vec_;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).dimensionality_ =
         local_98.end.dimensionality_;
    *(undefined4 *)&((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).field_0x14 =
         local_98.end._20_4_;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).dimensionality_ =
         local_98.begin.dimensionality_;
    *(undefined4 *)&((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).field_0x14 =
         local_98.begin._20_4_;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).item_ = local_98.end.item_;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).item_ = local_98.begin.item_
    ;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).vec_ = local_98.begin.vec_;
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_50 = &this->half_encoder_;
    local_48 = &this->numbers_encoder_;
    local_38 = pPVar10;
    do {
      pEVar16 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pEVar16 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 8;
      }
      sVar5 = pEVar16[-1].begin.item_;
      sVar6 = pEVar16[-1].end.item_;
      uVar19 = pEVar16[-1].last_axis;
      uVar3 = pEVar16[-1].stack_pos;
      if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_e8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_first + 8;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_first + 7;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      begin.item_._0_4_ = (int)sVar5;
      pvVar22 = (this->base_stack_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar3;
      levels = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar3;
      PVar11.vec_._0_4_ = begin.vec_._0_4_;
      PVar11.item_ = sVar5;
      PVar11.vec_._4_4_ = begin.vec_._4_4_;
      PVar11.dimensionality_ = begin.dimensionality_;
      PVar11._20_4_ = begin._20_4_;
      PVar12.vec_ = end.vec_;
      PVar12.item_ = sVar6;
      PVar12.dimensionality_ = end.dimensionality_;
      PVar12._20_4_ = end._20_4_;
      uVar13 = GetAndEncodeAxis<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                         (this,PVar11,PVar12,pvVar22,levels,uVar19);
      uVar23 = (ulong)uVar13;
      uVar19 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar23];
      uVar4 = this->bit_length_;
      if (uVar4 != uVar19) {
        uVar15 = (uint)(sVar6 - sVar5);
        if (uVar15 < 3) {
          puVar7 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          *puVar7 = uVar13;
          uVar23 = (ulong)this->dimension_;
          if (1 < this->dimension_) {
            uVar19 = *puVar7;
            uVar17 = 1;
            do {
              bVar24 = uVar19 == (int)uVar23 - 1U;
              uVar19 = uVar19 + 1;
              if (bVar24) {
                uVar19 = 0;
              }
              puVar7[uVar17] = uVar19;
              uVar17 = uVar17 + 1;
              uVar23 = (ulong)this->dimension_;
            } while (uVar17 < uVar23);
          }
          if (uVar15 != 0) {
            uVar23 = 0;
            do {
              if (this->dimension_ != 0) {
                uVar3 = local_38->dimensionality_;
                puVar8 = local_38->data0_;
                uVar17 = 0;
                do {
                  uVar14 = (ulong)(this->axes_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar17];
                  iVar20 = this->bit_length_ -
                           (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start[uVar14];
                  if (iVar20 != 0) {
                    DirectBitEncoder::EncodeLeastSignificantBits32
                              (&this->remaining_bits_encoder_,iVar20,
                               puVar8[(ulong)uVar3 * (sVar5 + uVar23) + uVar14]);
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 < this->dimension_);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != (uVar15 & 3));
          }
        }
        else {
          uVar17 = (ulong)(uVar3 + 1);
          local_40 = uVar17;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((this->base_stack_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17,pvVar22);
          pvVar9 = (this->base_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar1 = (int *)(*(long *)&pvVar9[uVar17].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + uVar23 * 4);
          *piVar1 = *piVar1 + (1 << ((char)uVar4 + ~(byte)uVar19 & 0x1f));
          std::
          __partition<draco::PointDVector<unsigned_int>::PointDVectorIterator,draco::DynamicIntegerPointsKdTreeEncoder<6>::Splitter>
                    (&local_140,
                     CONCAT44(*(undefined4 *)
                               (*(long *)&pvVar9[uVar17].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data + uVar23 * 4),uVar13));
          uVar21 = (int)sVar6 - local_140;
          uVar18 = local_140 - (int)begin.item_;
          if (uVar18 != uVar21) {
            DirectBitEncoder::EncodeBit(local_50,uVar18 < uVar21);
          }
          iVar20 = 0x1f;
          if (uVar15 != 0) {
            for (; uVar15 >> iVar20 == 0; iVar20 = iVar20 + -1) {
            }
          }
          if (uVar18 < uVar21) {
            uVar21 = uVar18;
          }
          FoldedBit32Encoder<draco::RAnsBitEncoder>::EncodeLeastSignificantBits32
                    (local_48,iVar20,((uint)(sVar6 - sVar5 >> 1) & 0x7fffffff) - uVar21);
          pvVar9 = (this->levels_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar22 = pvVar9 + uVar3;
          puVar2 = (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar23;
          *puVar2 = *puVar2 + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (pvVar9 + uVar17,pvVar22);
          if (CONCAT44(uStack_13c,local_140) != sVar5) {
            local_128.begin.dimensionality_ = begin.dimensionality_;
            local_128.begin._20_4_ = begin._20_4_;
            local_128.end.dimensionality_ = local_130;
            local_128.end._20_4_ = uStack_12c;
            local_128.end.item_ = CONCAT44(uStack_13c,local_140);
            local_128.end.vec_ = pPStack_138;
            local_128.num_remaining_points = local_140 - (int)begin.item_;
            local_128.begin.item_ = sVar5;
            local_128.begin.vec_ = pPVar10;
            local_128.last_axis = uVar13;
            local_128.stack_pos = uVar3;
            std::
            deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
            ::
            emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                      ((deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                        *)&local_e8,&local_128);
          }
          if (CONCAT44(uStack_13c,local_140) != sVar6) {
            local_128.begin.dimensionality_ = local_130;
            local_128.begin._20_4_ = uStack_12c;
            local_128.begin.item_ = CONCAT44(uStack_13c,local_140);
            local_128.begin.vec_ = pPStack_138;
            local_128.end.dimensionality_ = end.dimensionality_;
            local_128.end._20_4_ = end._20_4_;
            local_128.end.vec_ = end.vec_;
            local_128.stack_pos = (uint32_t)local_40;
            local_128.num_remaining_points = (int)sVar6 - local_140;
            local_128.end.item_ = sVar6;
            local_128.last_axis = uVar13;
            std::
            deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
            ::
            emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                      ((deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                        *)&local_e8,&local_128);
          }
        }
      }
    } while (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::~_Deque_base(&local_e8);
  return;
}

Assistant:

void DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodeInternal(
    RandomAccessIteratorT begin, RandomAccessIteratorT end) {
  typedef EncodingStatus<RandomAccessIteratorT> Status;

  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  Status init_status(begin, end, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    Status status = status_stack.top();
    status_stack.pop();

    begin = status.begin;
    end = status.end;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    const uint32_t axis =
        GetAndEncodeAxis(begin, end, old_base, levels, last_axis);
    const uint32_t level = levels[axis];
    const uint32_t num_remaining_points = static_cast<uint32_t>(end - begin);

    // If this happens all axis are subdivided to the end.
    if ((bit_length_ - level) == 0) {
      continue;
    }

    // Fast encoding of remaining bits if number of points is 1 or 2.
    // Doing this also for 2 gives a slight additional speed up.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        const auto &p = *(begin + i);
        for (uint32_t j = 0; j < dimension_; j++) {
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            remaining_bits_encoder_.EncodeLeastSignificantBits32(
                num_remaining_bits, p[axes_[j]]);
          }
        }
      }
      continue;
    }

    const uint32_t num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;  // copy
    base_stack_[stack_pos + 1][axis] += modifier;
    const VectorUint32 &new_base = base_stack_[stack_pos + 1];

    const RandomAccessIteratorT split =
        std::partition(begin, end, Splitter(axis, new_base[axis]));

    DRACO_DCHECK_EQ(true, (end - begin) > 0);

    // Encode number of points in first and second half.
    const int required_bits = MostSignificantBit(num_remaining_points);

    const uint32_t first_half = static_cast<uint32_t>(split - begin);
    const uint32_t second_half = static_cast<uint32_t>(end - split);
    const bool left = first_half < second_half;

    if (first_half != second_half) {
      half_encoder_.EncodeBit(left);
    }

    if (left) {
      EncodeNumber(required_bits, num_remaining_points / 2 - first_half);
    } else {
      EncodeNumber(required_bits, num_remaining_points / 2 - second_half);
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (split != begin) {
      status_stack.push(Status(begin, split, axis, stack_pos));
    }
    if (split != end) {
      status_stack.push(Status(split, end, axis, stack_pos + 1));
    }
  }
}